

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

node * list_insert_before(list *list,node *node,void *data)

{
  node *pnVar1;
  void *data_local;
  node *node_local;
  list *list_local;
  
  pnVar1 = node_create(data);
  pnVar1 = list_insert_node_before(list,node,pnVar1);
  return pnVar1;
}

Assistant:

struct node *list_insert_before(struct list *list, struct node *node, const void *data)
{
        return list_insert_node_before(list, node, node_create(data));
}